

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.c++
# Opt level: O2

void __thiscall
capnp::InputStreamMessageReader::~InputStreamMessageReader(InputStreamMessageReader *this)

{
  bool bVar1;
  anon_class_8_1_8991fb9c_for_func local_28;
  Runnable local_20;
  InputStreamMessageReader *local_18;
  
  (this->super_MessageReader)._vptr_MessageReader =
       (_func_int **)&PTR__InputStreamMessageReader_00674bf0;
  if (this->readPos != (byte *)0x0) {
    local_28.this = this;
    bVar1 = kj::UnwindDetector::isUnwinding(&this->unwindDetector);
    if (bVar1) {
      local_20._vptr_Runnable = (_func_int **)&PTR_run_00674cd8;
      local_18 = this;
      kj::UnwindDetector::catchExceptionsAsSecondaryFaults(&this->unwindDetector,&local_20);
    }
    else {
      kj::_::
      RunnableImpl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize.c++:243:47)>
      ::anon_class_8_1_8991fb9c_for_func::operator()(&local_28);
    }
  }
  kj::Array<capnp::word>::~Array(&this->ownedSpace);
  kj::Array<kj::ArrayPtr<const_capnp::word>_>::~Array(&this->moreSegments);
  SegmentArrayMessageReader::~SegmentArrayMessageReader((SegmentArrayMessageReader *)this);
  return;
}

Assistant:

InputStreamMessageReader::~InputStreamMessageReader() noexcept(false) {
  if (readPos != nullptr) {
    unwindDetector.catchExceptionsIfUnwinding([&]() {
      // Note that lazy reads only happen when we have multiple segments, so moreSegments.back() is
      // valid.
      const byte* allEnd = reinterpret_cast<const byte*>(moreSegments.back().end());
      inputStream.skip(allEnd - readPos);
    });
  }
}